

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesPackageRedirect(cmFindPackageCommand *this)

{
  cmMakefile *this_00;
  mapped_type *this_01;
  cmValue path;
  string debugBuffer;
  string local_b8;
  cmAlphaNum local_98;
  string local_68;
  cmAlphaNum local_48;
  
  this_01 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &PathLabel::PackageRedirect.super_PathLabel);
  this_00 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR",(allocator<char> *)&local_48);
  path = cmMakefile::GetDefinition(this_00,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if ((path.Value != (string *)0x0) && ((path.Value)->_M_string_length != 0)) {
    cmSearchPath::AddPath(this_01,path.Value);
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"The internally managed CMAKE_FIND_PACKAGE_REDIRECTS_DIR.\n",
               (allocator<char> *)&local_98);
    anon_unknown.dwarf_62e861::collectPathsForDebug(&local_b8,this_01,0);
    local_98.View_._M_str = (this->DebugBuffer)._M_dataplus._M_p;
    local_98.View_._M_len = (this->DebugBuffer)._M_string_length;
    local_48.View_._M_len = local_b8._M_string_length;
    local_48.View_._M_str = local_b8._M_dataplus._M_p;
    cmStrCat<>(&local_68,&local_98,&local_48);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesPackageRedirect()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::PackageRedirect];

  const auto redirectDir =
    this->Makefile->GetDefinition("CMAKE_FIND_PACKAGE_REDIRECTS_DIR");
  if (redirectDir && !redirectDir->empty()) {
    paths.AddPath(*redirectDir);
  }
  if (this->DebugMode) {
    std::string debugBuffer =
      "The internally managed CMAKE_FIND_PACKAGE_REDIRECTS_DIR.\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}